

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutFilter(If_Set_t *pCutSet,If_Cut_t *pCut,int fSaveCut0)

{
  uint uVar1;
  If_Cut_t *pIVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  If_Cut_t **ppIVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar5 = (ulong)pCutSet->nCuts;
  if (pCutSet->ppCuts[uVar5] != pCut) {
    __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                  ,0x96,"int If_CutFilter(If_Set_t *, If_Cut_t *, int)");
  }
  if (0 < pCutSet->nCuts) {
    iVar7 = 0;
    uVar12 = uVar5 & 0xffffffff;
    do {
      ppIVar6 = pCutSet->ppCuts;
      lVar9 = (long)iVar7;
      pIVar2 = ppIVar6[lVar9];
      uVar4 = *(uint *)&pIVar2->field_0x1c;
      uVar11 = uVar4 >> 0x18;
      uVar1 = *(uint *)&pCut->field_0x1c;
      uVar8 = uVar1 >> 0x18;
      if (uVar11 <= uVar8) {
        if ((pIVar2->uSign & ~pCut->uSign) == 0) {
          if (uVar4 < 0x1000000) {
            return 1;
          }
          uVar12 = 0;
          while( true ) {
            uVar13 = 0;
            if (0xffffff < uVar1) {
              uVar13 = 0;
              while ((&pIVar2[1].Area)[uVar12] != (&pCut[1].Area)[uVar13]) {
                uVar13 = uVar13 + 1;
                if (uVar8 == uVar13) goto LAB_0037a56f;
              }
            }
            if ((uint)uVar13 == uVar8) break;
            uVar12 = uVar12 + 1;
            if (uVar12 == uVar11) {
              return 1;
            }
          }
        }
        goto LAB_0037a56f;
      }
      sVar3 = (short)uVar5;
      if (iVar7 == 0) {
        if (sVar3 < 2) {
          if (fSaveCut0 == 0 || sVar3 != 1) goto LAB_0037a441;
          iVar7 = 0;
          uVar5 = 1;
        }
        else {
          if ((ppIVar6[1]->field_0x1d & 0x40) == 0) goto LAB_0037a441;
          iVar7 = 0;
        }
      }
      else {
LAB_0037a441:
        if ((pCut->uSign & ~pIVar2->uSign) == 0) {
          if (0xffffff < uVar1) {
            uVar13 = 0;
            do {
              uVar10 = 0;
              if (0xffffff < uVar4) {
                uVar10 = 0;
                while ((&pCut[1].Area)[uVar13] != (&pIVar2[1].Area)[uVar10]) {
                  uVar10 = uVar10 + 1;
                  if (uVar11 == uVar10) goto LAB_0037a56f;
                }
              }
              if ((uint)uVar10 == uVar11) goto LAB_0037a56f;
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar8);
          }
          if (iVar7 < (int)uVar12) {
            do {
              pCutSet->ppCuts[lVar9] = pCutSet->ppCuts[lVar9 + 1];
              lVar9 = lVar9 + 1;
            } while ((int)uVar12 != lVar9);
            ppIVar6 = pCutSet->ppCuts;
          }
          ppIVar6[sVar3] = pIVar2;
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
          pCutSet->nCuts = (short)uVar4;
          iVar7 = iVar7 + -1;
        }
      }
LAB_0037a56f:
      iVar7 = iVar7 + 1;
      uVar12 = (ulong)(uint)(int)(short)uVar5;
    } while (iVar7 < (short)uVar5);
  }
  return 0;
}

Assistant:

int If_CutFilter( If_Set_t * pCutSet, If_Cut_t * pCut, int fSaveCut0 )
{ 
    If_Cut_t * pTemp;
    int i, k;
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pTemp = pCutSet->ppCuts[i];
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // do not fiter the first cut
            if ( i == 0 && ((pCutSet->nCuts > 1 && pCutSet->ppCuts[1]->fUseless) || (fSaveCut0 && pCutSet->nCuts == 1)) )
                continue;
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pCut, pTemp ) )
            {
//                p->ppCuts[i] = p->ppCuts[p->nCuts-1];
//                p->ppCuts[p->nCuts-1] = pTemp;
//                p->nCuts--;
//                i--;
                // remove contained cut
                for ( k = i; k < pCutSet->nCuts; k++ )
                    pCutSet->ppCuts[k] = pCutSet->ppCuts[k+1];
                pCutSet->ppCuts[pCutSet->nCuts] = pTemp;
                pCutSet->nCuts--;
                i--;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pTemp, pCut ) )
                return 1;
        }
    }
    return 0;
}